

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputPrototypes(Node *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  string local_50;
  
  poVar2 = std::endl<char,std::char_traits<char>>(os);
  poVar2 = std::operator<<(poVar2,"//");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"// Function Prototypes");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"//");
  std::endl<char,std::char_traits<char>>(poVar2);
  do {
    if (this == (Node *)0x0) {
      std::endl<char,std::char_traits<char>>(os);
      return;
    }
    iVar1 = this->Type;
    if (iVar1 == 0x143) {
LAB_00109b65:
      VariableList::NewLevel(Variables);
      if (this->Block[2] != (Node *)0x0) {
        OutputPrototypes(this->Block[2],os);
      }
      VariableScanOne(this,1);
      VariableList::Fixup(Variables);
      OutputNewDefinition_abi_cxx11_(&local_50,this);
      poVar2 = std::operator<<(os,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,";");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_50);
      VariableList::KillLevel(Variables);
    }
    else if (iVar1 == 0x144) {
      if (this->Block[2] != (Node *)0x0) {
        OutputPrototypes(this->Block[2],os);
      }
    }
    else if (((iVar1 == 0x14e) || (iVar1 == 0x1a1)) || (iVar1 == 0x17c)) goto LAB_00109b65;
    this = this->Block[0];
  } while( true );
}

Assistant:

void Node::OutputPrototypes(
	std::ostream& os	/**< iostream to write the C++ code to */
)
{
	Node* ThisNode = this;

	//
	// Output title for prototype section
	//
	os << std::endl <<
		"//" << std::endl <<
		"// Function Prototypes" << std::endl <<
		"//" << std::endl;

	//
	// Go through the level 0 functions
	//
	while(ThisNode != 0)
	{

		switch(ThisNode->Type)
		{
		case BAS_S_PROGRAM:
		case BAS_S_FUNCTION:
		case BAS_S_SUB:
		case BAS_S_HANDLER:

			//
			// Empty variable list
			//
			Variables->NewLevel();

			//
			// Handle any DEF*'s that are in there
			//
			if (ThisNode->Block[2] != 0)
			{
				ThisNode->Block[2]->OutputPrototypes(os);
			}

			//
			// Scan the call parameters
			//
			ThisNode->VariableScanOne(1);
			Variables->Fixup();

			//
			// Output function name
			//
			os << ThisNode->OutputNewDefinition() << ";" << std::endl;

			Variables->KillLevel();

			break;

		case BAS_S_MAINFUNCTION:
			//
			// Handle any DEF*'s that are in there
			//
			if (ThisNode->Block[2] != 0)
			{
				ThisNode->Block[2]->OutputPrototypes(os);
			}
			break;

		}

		ThisNode = ThisNode->Block[0];
	}

	os << std::endl;
}